

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio_newc.c
# Opt level: O0

int write_header(archive_write *a,archive_entry *entry)

{
  archive_entry *paVar1;
  wchar_t wVar2;
  int iVar3;
  mode_t mVar5;
  uint uVar6;
  int iVar7;
  int *piVar8;
  char *pcVar9;
  char *pcVar10;
  dev_t dVar11;
  int64_t iVar12;
  time_t v;
  size_t sVar13;
  size_t sStack_d0;
  int pad;
  size_t len;
  archive_entry *entry_main;
  archive_string_conv *sconv;
  char h [110];
  int local_40;
  int ret_final;
  int ret;
  int pathlength;
  char *path;
  char *p;
  cpio_conflict1 *cpio;
  int64_t ino;
  archive_entry *entry_local;
  archive_write *a_local;
  int iVar4;
  
  p = (char *)a->format_data;
  stack0xffffffffffffffbc = 0;
  ino = (int64_t)entry;
  entry_local = (archive_entry *)a;
  entry_main = (archive_entry *)get_sconv(a);
  len = 0;
  wVar2 = _archive_entry_pathname_l
                    ((archive_entry *)ino,(char **)&ret,&stack0xffffffffffffff30,
                     (archive_string_conv *)entry_main);
  if (wVar2 != L'\0') {
    piVar8 = __errno_location();
    paVar1 = entry_local;
    if (*piVar8 == 0xc) {
      archive_set_error((archive *)entry_local,0xc,"Can\'t allocate memory for Pathname");
      stack0xffffffffffffffbc = -0x1e;
      goto LAB_007e028c;
    }
    pcVar9 = archive_entry_pathname((archive_entry *)ino);
    pcVar10 = archive_string_conversion_charset_name((archive_string_conv *)entry_main);
    archive_set_error((archive *)paVar1,0x54,"Can\'t translate pathname \'%s\' to %s",pcVar9,pcVar10
                     );
    stack0xffffffffffffffbc = -0x14;
  }
  iVar4 = (int)sStack_d0;
  iVar3 = iVar4 + 1;
  memset(&sconv,0,0x6e);
  format_hex(0x70701,&sconv,6);
  dVar11 = archive_entry_devmajor((archive_entry *)ino);
  format_hex(dVar11,h + 0x36,8);
  dVar11 = archive_entry_devminor((archive_entry *)ino);
  format_hex(dVar11,h + 0x3e,8);
  cpio = (cpio_conflict1 *)archive_entry_ino64((archive_entry *)ino);
  if (0xffffffff < (long)cpio) {
    archive_set_error((archive *)entry_local,0x22,"large inode number truncated");
    stack0xffffffffffffffbc = -0x14;
  }
  format_hex((ulong)cpio & 0xffffffff,(void *)((long)&sconv + 6),8);
  mVar5 = archive_entry_mode((archive_entry *)ino);
  format_hex((ulong)mVar5,h + 6,8);
  iVar12 = archive_entry_uid((archive_entry *)ino);
  format_hex(iVar12,h + 0xe,8);
  iVar12 = archive_entry_gid((archive_entry *)ino);
  format_hex(iVar12,h + 0x16,8);
  uVar6 = archive_entry_nlink((archive_entry *)ino);
  format_hex((ulong)uVar6,h + 0x1e,8);
  mVar5 = archive_entry_filetype((archive_entry *)ino);
  if ((mVar5 == 0x6000) || (mVar5 = archive_entry_filetype((archive_entry *)ino), mVar5 == 0x2000))
  {
    dVar11 = archive_entry_rdevmajor((archive_entry *)ino);
    format_hex(dVar11,h + 0x46,8);
    dVar11 = archive_entry_rdevminor((archive_entry *)ino);
    format_hex(dVar11,h + 0x4e,8);
  }
  else {
    format_hex(0,h + 0x46,8);
    format_hex(0,h + 0x4e,8);
  }
  v = archive_entry_mtime((archive_entry *)ino);
  format_hex(v,h + 0x26,8);
  format_hex((long)iVar3,h + 0x56,8);
  format_hex(0,h + 0x5e,8);
  mVar5 = archive_entry_filetype((archive_entry *)ino);
  if (mVar5 != 0x8000) {
    archive_entry_set_size((archive_entry *)ino,0);
  }
  wVar2 = _archive_entry_symlink_l
                    ((archive_entry *)ino,&path,&stack0xffffffffffffff30,
                     (archive_string_conv *)entry_main);
  if (wVar2 != L'\0') {
    piVar8 = __errno_location();
    paVar1 = entry_local;
    if (*piVar8 == 0xc) {
      archive_set_error((archive *)entry_local,0xc,"Can\'t allocate memory for Likname");
      stack0xffffffffffffffbc = -0x1e;
      goto LAB_007e028c;
    }
    pcVar9 = archive_entry_symlink((archive_entry *)ino);
    pcVar10 = archive_string_conversion_charset_name((archive_string_conv *)entry_main);
    archive_set_error((archive *)paVar1,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar9,pcVar10
                     );
    stack0xffffffffffffffbc = -0x14;
  }
  if (((sStack_d0 == 0) || (path == (char *)0x0)) || (*path == '\0')) {
    iVar12 = archive_entry_size((archive_entry *)ino);
    local_40 = format_hex(iVar12,h + 0x2e,8);
  }
  else {
    sVar13 = strlen(path);
    local_40 = format_hex(sVar13,h + 0x2e,8);
  }
  if (local_40 == 0) {
    iVar7 = __archive_write_output((archive_write *)entry_local,&sconv,0x6e);
    if (iVar7 == 0) {
      iVar3 = __archive_write_output((archive_write *)entry_local,_ret,(long)iVar3);
      if (iVar3 == 0) {
        uVar6 = (iVar4 + 0x6fU ^ 0xffffffff) + 1 & 3;
        if ((uVar6 == 0) ||
           (iVar3 = __archive_write_output((archive_write *)entry_local,"",(long)(int)uVar6),
           iVar3 == 0)) {
          iVar12 = archive_entry_size((archive_entry *)ino);
          paVar1 = entry_local;
          pcVar9 = path;
          *(int64_t *)p = iVar12;
          *(uint *)(p + 8) = ((uint)*(undefined8 *)p ^ 0xffffffff) + 1 & 3;
          if ((path != (char *)0x0) && (*path != '\0')) {
            sVar13 = strlen(path);
            iVar3 = __archive_write_output((archive_write *)paVar1,pcVar9,sVar13);
            if (iVar3 == 0) {
              sVar13 = strlen(path);
              iVar3 = __archive_write_output
                                ((archive_write *)entry_local,"",
                                 (long)(int)(((uint)sVar13 ^ 0xffffffff) + 1 & 3));
              if (iVar3 != 0) {
                stack0xffffffffffffffbc = -0x1e;
              }
            }
            else {
              stack0xffffffffffffffbc = -0x1e;
            }
          }
        }
        else {
          stack0xffffffffffffffbc = -0x1e;
        }
      }
      else {
        stack0xffffffffffffffbc = -0x1e;
      }
    }
    else {
      stack0xffffffffffffffbc = -0x1e;
    }
  }
  else {
    archive_set_error((archive *)entry_local,0x22,"File is too large for this format.");
    stack0xffffffffffffffbc = -0x19;
  }
LAB_007e028c:
  if (len != 0) {
    archive_entry_free((archive_entry *)len);
  }
  return stack0xffffffffffffffbc;
}

Assistant:

static int
write_header(struct archive_write *a, struct archive_entry *entry)
{
	int64_t ino;
	struct cpio *cpio;
	const char *p, *path;
	int pathlength, ret, ret_final;
	char h[c_header_size];
	struct archive_string_conv *sconv;
	struct archive_entry *entry_main;
	size_t len;
	int pad;

	cpio = (struct cpio *)a->format_data;
	ret_final = ARCHIVE_OK;
	sconv = get_sconv(a);

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pahtname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate ustar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif

	ret = archive_entry_pathname_l(entry, &path, &len, sconv);
	if (ret != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate pathname '%s' to %s",
		    archive_entry_pathname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret_final = ARCHIVE_WARN;
	}
	pathlength = (int)len + 1; /* Include trailing null. */

	memset(h, 0, c_header_size);
	format_hex(0x070701, h + c_magic_offset, c_magic_size);
	format_hex(archive_entry_devmajor(entry), h + c_devmajor_offset,
	    c_devmajor_size);
	format_hex(archive_entry_devminor(entry), h + c_devminor_offset,
	    c_devminor_size);

	ino = archive_entry_ino64(entry);
	if (ino > 0xffffffff) {
		archive_set_error(&a->archive, ERANGE,
		    "large inode number truncated");
		ret_final = ARCHIVE_WARN;
	}

	/* TODO: Set ret_final to ARCHIVE_WARN if any of these overflow. */
	format_hex(ino & 0xffffffff, h + c_ino_offset, c_ino_size);
	format_hex(archive_entry_mode(entry), h + c_mode_offset, c_mode_size);
	format_hex(archive_entry_uid(entry), h + c_uid_offset, c_uid_size);
	format_hex(archive_entry_gid(entry), h + c_gid_offset, c_gid_size);
	format_hex(archive_entry_nlink(entry), h + c_nlink_offset, c_nlink_size);
	if (archive_entry_filetype(entry) == AE_IFBLK
	    || archive_entry_filetype(entry) == AE_IFCHR) {
	    format_hex(archive_entry_rdevmajor(entry), h + c_rdevmajor_offset, c_rdevmajor_size);
	    format_hex(archive_entry_rdevminor(entry), h + c_rdevminor_offset, c_rdevminor_size);
	} else {
	    format_hex(0, h + c_rdevmajor_offset, c_rdevmajor_size);
	    format_hex(0, h + c_rdevminor_offset, c_rdevminor_size);
	}
	format_hex(archive_entry_mtime(entry), h + c_mtime_offset, c_mtime_size);
	format_hex(pathlength, h + c_namesize_offset, c_namesize_size);
	format_hex(0, h + c_checksum_offset, c_checksum_size);

	/* Non-regular files don't store bodies. */
	if (archive_entry_filetype(entry) != AE_IFREG)
		archive_entry_set_size(entry, 0);

	/* Symlinks get the link written as the body of the entry. */
	ret = archive_entry_symlink_l(entry, &p, &len, sconv);
	if (ret != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Likname");
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate linkname '%s' to %s",
		    archive_entry_symlink(entry),
		    archive_string_conversion_charset_name(sconv));
		ret_final = ARCHIVE_WARN;
	}
	if (len > 0 && p != NULL  &&  *p != '\0')
		ret = format_hex(strlen(p), h + c_filesize_offset,
		    c_filesize_size);
	else
		ret = format_hex(archive_entry_size(entry),
		    h + c_filesize_offset, c_filesize_size);
	if (ret) {
		archive_set_error(&a->archive, ERANGE,
		    "File is too large for this format.");
		ret_final = ARCHIVE_FAILED;
		goto exit_write_header;
	}

	ret = __archive_write_output(a, h, c_header_size);
	if (ret != ARCHIVE_OK) {
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}

	/* Pad pathname to even length. */
	ret = __archive_write_output(a, path, pathlength);
	if (ret != ARCHIVE_OK) {
		ret_final = ARCHIVE_FATAL;
		goto exit_write_header;
	}
	pad = PAD4(pathlength + c_header_size);
	if (pad) {
		ret = __archive_write_output(a, "\0\0\0", pad);
		if (ret != ARCHIVE_OK) {
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
	}

	cpio->entry_bytes_remaining = archive_entry_size(entry);
	cpio->padding = (int)PAD4(cpio->entry_bytes_remaining);

	/* Write the symlink now. */
	if (p != NULL  &&  *p != '\0') {
		ret = __archive_write_output(a, p, strlen(p));
		if (ret != ARCHIVE_OK) {
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		pad = PAD4(strlen(p));
		ret = __archive_write_output(a, "\0\0\0", pad);
		if (ret != ARCHIVE_OK) {
			ret_final = ARCHIVE_FATAL;
			goto exit_write_header;
		}
	}
exit_write_header:
	if (entry_main)
		archive_entry_free(entry_main);
	return (ret_final);
}